

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-naming.h
# Opt level: O0

void wabt::RenameAll(Module *module)

{
  initializer_list<wabt::string_view> __l;
  allocator<wabt::string_view> local_142;
  less<wabt::string_view> local_141;
  string_view local_140;
  string_view sStack_130;
  string_view sStack_120;
  string_view sStack_110;
  string_view sStack_100;
  string_view sStack_f0;
  string_view sStack_e0;
  string_view sStack_d0;
  string_view sStack_c0;
  string_view sStack_b0;
  string_view sStack_a0;
  string_view sStack_90;
  string_view sStack_80;
  string_view sStack_70;
  string_view sStack_60;
  iterator local_50;
  size_type local_48;
  undefined1 local_40 [8];
  set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_> filter;
  Module *module_local;
  
  filter._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)module;
  string_view::string_view(&local_140,"const");
  string_view::string_view(&sStack_130,"std");
  string_view::string_view(&sStack_120,"allocator");
  string_view::string_view(&sStack_110,"char");
  string_view::string_view(&sStack_100,"basic");
  string_view::string_view(&sStack_f0,"traits");
  string_view::string_view(&sStack_e0,"wchar");
  string_view::string_view(&sStack_d0,"t");
  string_view::string_view(&sStack_c0,"void");
  string_view::string_view(&sStack_b0,"int");
  string_view::string_view(&sStack_a0,"unsigned");
  string_view::string_view(&sStack_90,"2");
  string_view::string_view(&sStack_80,"cxxabiv1");
  string_view::string_view(&sStack_70,"short");
  string_view::string_view(&sStack_60,"4096ul");
  local_50 = &local_140;
  local_48 = 0xf;
  std::allocator<wabt::string_view>::allocator(&local_142);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>::set
            ((set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
              *)local_40,__l,&local_141,&local_142);
  std::allocator<wabt::string_view>::~allocator(&local_142);
  RenameToIdentifiers<wabt::Func>
            ((vector<wabt::Func_*,_std::allocator<wabt::Func_*>_> *)
             (filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x88),
             (BindingHash *)(filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x1b0),
             (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
              *)local_40);
  RenameToIdentifiers<wabt::Global>
            ((vector<wabt::Global_*,_std::allocator<wabt::Global_*>_> *)
             (filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0xa0),
             (BindingHash *)(filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x1e8),
             (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
              *)0x0);
  RenameToIdentifiers<wabt::Table>
            ((vector<wabt::Table_*,_std::allocator<wabt::Table_*>_> *)
             (filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x100),
             (BindingHash *)(filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x290),
             (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
              *)0x0);
  RenameToIdentifiers<wabt::Event>
            ((vector<wabt::Event_*,_std::allocator<wabt::Event_*>_> *)
             (filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x70),
             (BindingHash *)(filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x178),
             (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
              *)0x0);
  RenameToIdentifiers<wabt::Export>
            ((vector<wabt::Export_*,_std::allocator<wabt::Export_*>_> *)
             (filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0xd0),
             (BindingHash *)(filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x220),
             (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
              *)0x0);
  RenameToIdentifiers<wabt::TypeEntry>
            ((vector<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_> *)
             (filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0xe8),
             (BindingHash *)(filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 600),
             (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
              *)0x0);
  RenameToIdentifiers<wabt::Memory>
            ((vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_> *)
             (filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x130),
             (BindingHash *)(filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x2c8),
             (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
              *)0x0);
  RenameToIdentifiers<wabt::DataSegment>
            ((vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_> *)
             (filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x148),
             (BindingHash *)(filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x300),
             (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
              *)0x0);
  RenameToIdentifiers<wabt::ElemSegment>
            ((vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_> *)
             (filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x118),
             (BindingHash *)(filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x338),
             (set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>
              *)0x0);
  RenameToContents((vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_> *)
                   (filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x148),
                   (BindingHash *)(filter._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x300))
  ;
  std::set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_>::
  ~set((set<wabt::string_view,_std::less<wabt::string_view>,_std::allocator<wabt::string_view>_> *)
       local_40);
  return;
}

Assistant:

void RenameAll(Module& module) {
  // We also filter common C++ keywords/STL idents that make for huge
  // identifiers.
  // FIXME: this can obviously give bad results if the input is not C++..
  std::set<string_view> filter = {
    { "const" },
    { "std" },
    { "allocator" },
    { "char" },
    { "basic" },
    { "traits" },
    { "wchar" },
    { "t" },
    { "void" },
    { "int" },
    { "unsigned" },
    { "2" },
    { "cxxabiv1" },
    { "short" },
    { "4096ul" },
  };
  RenameToIdentifiers(module.funcs, module.func_bindings, &filter);
  // Also do this for some other kinds of names, but without the keyword
  // substitution.
  RenameToIdentifiers(module.globals, module.global_bindings, nullptr);
  RenameToIdentifiers(module.tables, module.table_bindings, nullptr);
  RenameToIdentifiers(module.events, module.event_bindings, nullptr);
  RenameToIdentifiers(module.exports, module.export_bindings, nullptr);
  RenameToIdentifiers(module.types, module.type_bindings, nullptr);
  RenameToIdentifiers(module.memories, module.memory_bindings, nullptr);
  RenameToIdentifiers(module.data_segments, module.data_segment_bindings,
                      nullptr);
  RenameToIdentifiers(module.elem_segments, module.elem_segment_bindings,
                      nullptr);
  // Special purpose naming for data segments.
  RenameToContents(module.data_segments, module.data_segment_bindings);
}